

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDirFrame.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLinkDirFrame::SetDirectionInAbsoluteCoords
          (ChLinkDirFrame *this,ChVector<double> *dir_abs)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  element_type *peVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 local_18 [16];
  double local_8;
  
  peVar4 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar4 != (element_type *)0x0) {
    dVar1 = dir_abs->m_data[1];
    auVar7._8_8_ = dir_abs->m_data[0];
    auVar7._0_8_ = dir_abs->m_data[0];
    auVar8._8_8_ = dir_abs->m_data[2];
    auVar8._0_8_ = dir_abs->m_data[2];
    auVar5._0_8_ = dVar1 * *(double *)
                            ((long)&(peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.
                                    Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> +
                            0x18);
    auVar5._8_8_ = dVar1 * *(double *)
                            ((long)&(peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.
                                    Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> +
                            0x20);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(double *)
                    ((long)&(peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x10);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar1 * *(double *)
                            ((long)&(peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.
                                    Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> +
                            0x28);
    auVar6 = vfmadd231sd_fma(auVar6,auVar7,auVar2);
    auVar2 = vfmadd231pd_fma(auVar5,auVar7,
                             *(undefined1 (*) [16])
                              (peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(double *)
                    ((long)&(peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x40);
    auVar3 = vfmadd231sd_fma(auVar6,auVar8,auVar3);
    local_18 = vfmadd231pd_fma(auVar2,auVar8,
                               *(undefined1 (*) [16])
                                ((long)&(peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.
                                        Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                + 0x30));
    local_8 = auVar3._0_8_;
    SetDirectionInBodyCoords(this,(ChVector<double> *)local_18);
    return;
  }
  __assert_fail("m_body",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChLinkDirFrame.cpp"
                ,0x31,
                "void chrono::fea::ChLinkDirFrame::SetDirectionInAbsoluteCoords(const ChVector<> &)"
               );
}

Assistant:

void ChLinkDirFrame::SetDirectionInAbsoluteCoords(const ChVector<>& dir_abs) {
    assert(m_body);
    ChVector<> dir_loc = m_body->TransformDirectionParentToLocal(dir_abs);
    SetDirectionInBodyCoords(dir_loc);
}